

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.h
# Opt level: O2

bool __thiscall Group::intersect(Group *this,Ray *r,Hit *h,float tmin)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  Vector3f *v0;
  bool bVar4;
  int *piVar5;
  float fVar6;
  Vector3f local_3c;
  
  if ((this->obj).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->obj).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar4 = false;
  }
  else {
    piVar1 = (this->rs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar4 = false;
    for (piVar5 = (this->rs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start; piVar5 != piVar1; piVar5 = piVar5 + 1) {
      bVar2 = intersect(this,*piVar5,r,h,tmin);
      bVar4 = (bool)(bVar4 | bVar2);
    }
    if (bVar4 != false) {
      iVar3 = (*h->obj->m->_vptr_Material[3])();
      if ((char)iVar3 != '\0') {
        v0 = &h->norm;
        operator-(&r->d);
        fVar6 = Vector3f::dot(v0,&local_3c);
        bVar4 = true;
        if (fVar6 < 0.0) {
          operator-(v0);
          Vector3f::operator=(v0,&local_3c);
        }
      }
    }
  }
  return bVar4;
}

Assistant:

bool intersect(const Ray& r, Hit& h, float tmin) {
#ifdef NOKD
		bool ok = 0;
		for (auto o : obj)
			if (o) ok |= o->intersect(r, h, tmin);
		return ok;
#else
		if (obj.empty()) return 0;
//		std::cerr << "INTERSECT TEST:" << obj.size() << "\n";
		bool ok = 0;
		for (auto g : rs)
			ok |= intersect(g, r, h, tmin);
		if (ok && h.obj->m->fix_norm() && Vector3f::dot(h.norm, -r.d) < 0)
			h.norm = -h.norm;
		return ok;
#endif
	}